

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O1

TestResult *
JsonTest::checkEqual<unsigned_int,double>
          (TestResult *result,uint expected,double actual,char *file,uint line,char *expr)

{
  TestResult *pTVar1;
  double dVar2;
  double local_18;
  double local_10;
  
  dVar2 = (double)expected;
  if ((dVar2 != actual) || (NAN(dVar2) || NAN(actual))) {
    local_18 = actual;
    TestResult::addFailure(result,file,line,expr);
    pTVar1 = TestResult::operator<<(result,(char (*) [11])"Expected: ");
    local_10 = dVar2;
    pTVar1 = TestResult::operator<<(pTVar1,&local_10);
    TestResult::operator<<(pTVar1,(char (*) [2])0x14a14b);
    pTVar1 = TestResult::operator<<(result,(char (*) [11])"Actual  : ");
    TestResult::operator<<(pTVar1,&local_18);
  }
  return result;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}